

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O3

void BCL::local_free<char>(GlobalPtr<char> *ptr)

{
  char *pcVar1;
  long *plVar2;
  int iVar3;
  char *pcVar4;
  runtime_error *this;
  char *pcVar5;
  long *plVar6;
  ulong *puVar7;
  long lVar8;
  
  if (bcl_finalized != '\0') {
    return;
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)malloc_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pcVar4 = GlobalPtr<char>::local(ptr);
  if (pcVar4 != (char *)0x0) {
    pcVar1 = pcVar4 + -0x40;
    puVar7 = (ulong *)&flist;
    do {
      pcVar5 = (char *)*puVar7;
      if (pcVar5 == (char *)0x0) break;
      puVar7 = (ulong *)(pcVar5 + 0x10);
    } while (pcVar1 <= pcVar5);
    if (pcVar5 == (char *)0x0) {
      puVar7 = (ulong *)&flist;
      *(long *)(pcVar4 + -0x30) = flist;
      pcVar4[-0x38] = '\0';
      pcVar4[-0x37] = '\0';
      pcVar4[-0x36] = '\0';
      pcVar4[-0x35] = '\0';
      pcVar4[-0x34] = '\0';
      pcVar4[-0x33] = '\0';
      pcVar4[-0x32] = '\0';
      pcVar4[-0x31] = '\0';
      if (flist != 0) {
        *(char **)(flist + 8) = pcVar1;
      }
    }
    else {
      if (pcVar1 <= pcVar5) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"AGH!!!! What a world, what a world! This was never supposed to happen.\n");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar8 = *(long *)(pcVar5 + 0x10);
      *(long *)(pcVar4 + -0x30) = lVar8;
      *(char **)(pcVar4 + -0x38) = pcVar5;
      if (lVar8 != 0) {
        *(char **)(lVar8 + 8) = pcVar1;
        pcVar5 = *(char **)(pcVar4 + -0x38);
      }
      puVar7 = (ulong *)(pcVar5 + 0x10);
    }
    *puVar7 = (ulong)pcVar1;
    lVar8 = *(long *)(pcVar4 + -0x40);
    plVar6 = *(long **)(pcVar4 + -0x30);
    if (plVar6 == (long *)(pcVar4 + lVar8)) {
      lVar8 = lVar8 + *plVar6 + 0x40;
      *(long *)(pcVar4 + -0x40) = lVar8;
      plVar6 = (long *)plVar6[2];
      *(long **)(pcVar4 + -0x30) = plVar6;
      if (plVar6 == (long *)0x0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6[1] = (long)pcVar1;
      }
    }
    plVar2 = *(long **)(pcVar4 + -0x38);
    if ((plVar2 != (long *)0x0) &&
       (pcVar1 == (char *)plVar2[2] && (char *)((long)plVar2 + *plVar2 + 0x40) == (char *)plVar2[2])
       ) {
      *plVar2 = *plVar2 + lVar8 + 0x40;
      plVar2[2] = (long)plVar6;
      if (plVar6 != (long *)0x0) {
        plVar6[1] = (long)plVar2;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
  return;
}

Assistant:

inline void local_free(const GlobalPtr <T> &ptr) {
  if (bcl_finalized) {
    return;
  }
  BCL::malloc_mutex.lock();
  char *vptr = (char *) ptr.local();

  if (vptr == nullptr) {
    BCL::malloc_mutex.unlock();
    return;
  }

  chunk_t *my_chunk = (chunk_t *) (vptr - chunk_t_size());
  chunk_t *neighbor_chunk = flist;

  // Keep free list in order to
  // make compaction easy
  while (neighbor_chunk != NULL) {
    if (my_chunk > neighbor_chunk) {
      break;
    }
    neighbor_chunk = neighbor_chunk->next;
  }

  // I am the primordial chunk.
  if (neighbor_chunk == NULL) {
    my_chunk->next = flist;
    my_chunk->last = NULL;
    if (flist != NULL) {
      flist->last = my_chunk;
    }
    flist = my_chunk;
  } else {
    if (my_chunk > neighbor_chunk) {
      my_chunk->next = neighbor_chunk->next;
      my_chunk->last = neighbor_chunk;
      if (my_chunk->next != NULL) {
        my_chunk->next->last = my_chunk;
      }
      my_chunk->last->next = my_chunk;
    } else {
      throw std::runtime_error("AGH!!!! What a world, what a world! This was never supposed to happen.\n");
      // TODO: there's a bug here--the "primordial chunk" can be lost.
      my_chunk->next = neighbor_chunk;
      my_chunk->last = neighbor_chunk->last;
      my_chunk->next->last = my_chunk;
      if (my_chunk->last != NULL) {
        my_chunk->last->next = my_chunk;
      }
      if (flist == neighbor_chunk) {
        flist = my_chunk;
      }
    }
  }

  // Compact!

  // If chunk directly after is free, compact.
  if ((char *) my_chunk->next == ((char *) my_chunk) + chunk_t_size() + my_chunk->size) {
    my_chunk->size += chunk_t_size() + my_chunk->next->size;
    my_chunk->next = my_chunk->next->next;
    if (my_chunk->next != NULL) {
      my_chunk->next->last = my_chunk;
    }
  }

  // If chunk directly before is free, compact.
  if (my_chunk->last != NULL &&
    (char *) my_chunk->last->next == ((char *) my_chunk->last) + chunk_t_size() + my_chunk->last->size &&
    my_chunk->last->next == my_chunk) {
      my_chunk->last->size += chunk_t_size() + my_chunk->size;
      my_chunk->last->next = my_chunk->next;
      if (my_chunk->last->next != NULL) {
        my_chunk->last->next->last = my_chunk->last;
      }
  }
  BCL::malloc_mutex.unlock();
}